

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int nni_msg_trim(nni_msg *m,size_t len)

{
  uint8_t **ppuVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  
  uVar2 = (m->m_body).ch_len;
  iVar3 = 3;
  if (len <= uVar2) {
    sVar4 = uVar2 - len;
    (m->m_body).ch_len = sVar4;
    iVar3 = 0;
    if (sVar4 != 0) {
      ppuVar1 = &(m->m_body).ch_ptr;
      *ppuVar1 = *ppuVar1 + len;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
nni_msg_trim(nni_msg *m, size_t len)
{
	return (nni_chunk_trim(&m->m_body, len));
}